

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_mutex-unix.c
# Opt level: O2

void global_os_mutex_lock(void)

{
  pthread_once(&global_os_mutex_lock::global_os_mutex_is_initialized,create_global_os_mutex);
  if (global_os_mutex != (os_mutex *)0x0) {
    __cilkrts_os_mutex_lock(global_os_mutex);
    return;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/os_mutex-unix.c"
                ,0xbb,"NULL != global_os_mutex");
}

Assistant:

void global_os_mutex_lock(void)
{
    // pthread_once_t used with pthread_once to guarantee that
    // create_global_os_mutex() is only called once
    static pthread_once_t global_os_mutex_is_initialized = PTHREAD_ONCE_INIT;

    // Execute create_global_os_mutex once in a thread-safe manner
    // Note that create_global_os_mutex returns the mutex in the static
    // (global to the module) variable "global_os_mutex"
    pthread_once(&global_os_mutex_is_initialized,
		 create_global_os_mutex);

    // We'd better have allocated a global_os_mutex
    CILK_ASSERT(NULL != global_os_mutex);
    
    // Acquire the global OS mutex
    __cilkrts_os_mutex_lock(global_os_mutex);
}